

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplicationPrivate::giveFocusAccordingToFocusPolicy
               (QWidget *widget,QEvent *event,QPoint localPos)

{
  short sVar1;
  long lVar2;
  long lVar3;
  FocusPolicy policy;
  char cVar4;
  bool bVar5;
  int iVar6;
  QPoint QVar7;
  QWidget *pQVar8;
  long in_FS_OFFSET;
  QRect local_40;
  QPoint localPos_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  localPos_local = localPos;
  QGuiApplication::styleHints();
  cVar4 = QStyleHints::setFocusOnTouchRelease();
  if ((giveFocusAccordingToFocusPolicy(QWidget*,QEvent*,QPoint)::focusedWidgetOnTouchBegin == '\0')
     && (iVar6 = __cxa_guard_acquire(&giveFocusAccordingToFocusPolicy(QWidget*,QEvent*,QPoint)::
                                      focusedWidgetOnTouchBegin), iVar6 != 0)) {
    __cxa_atexit(QPointer<QWidget>::~QPointer,
                 &giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin,0x7fe000);
    __cxa_guard_release(&giveFocusAccordingToFocusPolicy(QWidget*,QEvent*,QPoint)::
                         focusedWidgetOnTouchBegin);
  }
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 2) goto LAB_002c089d;
  if (sVar1 == 3) {
LAB_002c08c0:
    if (cVar4 == '\0') goto LAB_002c09cb;
    if ((giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.value,
       *(int *)(giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    if (pQVar8 != focus_widget) goto LAB_002c09cb;
LAB_002c08bc:
    policy = ClickFocus;
  }
  else {
    if (sVar1 == 4) {
LAB_002c089d:
      QWeakPointer<QObject>::assign<QObject>
                (&giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp,
                 &focus_widget->super_QObject);
      if (cVar4 != '\0') goto LAB_002c09cb;
      goto LAB_002c08bc;
    }
    if (sVar1 != 0x1f) {
      if (sVar1 == 0xc4) goto LAB_002c08c0;
      if (sVar1 != 0xc2) goto LAB_002c09cb;
      goto LAB_002c089d;
    }
    policy = WheelFocus;
  }
  for (; widget != (QWidget *)0x0; widget = *(QWidget **)(*(long *)&widget->field_0x8 + 0x10)) {
    if ((widget->data->widget_attributes & 1) == 0) {
      local_40 = QWidget::rect(widget);
      cVar4 = QRect::contains((QPoint *)&local_40,SUB81(&localPos_local,0));
      if ((cVar4 != '\0') && (bVar5 = shouldSetFocus(widget,policy), bVar5)) {
        QWidget::setFocus(widget,MouseFocusReason);
        break;
      }
    }
    if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) break;
    lVar3 = *(long *)(*(long *)&widget->field_0x8 + 0x78);
    pQVar8 = widget;
    if ((lVar3 != 0) && (bVar5 = QPointer::operator_cast_to_bool((QPointer *)(lVar3 + 0x30)), bVar5)
       ) {
      pQVar8 = *(QWidget **)(*(long *)(*(long *)&widget->field_0x8 + 0x78) + 0x38);
    }
    bVar5 = QWidget::hasFocus(pQVar8);
    if (bVar5) break;
    QVar7 = QWidget::pos(widget);
    localPos_local.yp.m_i = localPos_local.yp.m_i + QVar7.yp.m_i.m_i;
    localPos_local.xp.m_i = localPos_local.xp.m_i + QVar7.xp.m_i.m_i;
  }
LAB_002c09cb:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::giveFocusAccordingToFocusPolicy(QWidget *widget, QEvent *event, QPoint localPos)
{
    const bool setFocusOnRelease = QGuiApplication::styleHints()->setFocusOnTouchRelease();
    Qt::FocusPolicy focusPolicy = Qt::ClickFocus;
    static QPointer<QWidget> focusedWidgetOnTouchBegin = nullptr;

    switch (event->type()) {
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonDblClick:
        case QEvent::TouchBegin:
            focusedWidgetOnTouchBegin = QApplication::focusWidget();
            if (setFocusOnRelease)
                return;
            break;
        case QEvent::MouseButtonRelease:
        case QEvent::TouchEnd:
            if (!setFocusOnRelease)
                return;
            if (focusedWidgetOnTouchBegin != QApplication::focusWidget()) {
                // Focus widget was changed while delivering press/move events.
                // To not interfere with application logic, we leave focus as-is
                return;
            }
            break;
        case QEvent::Wheel:
            focusPolicy = Qt::WheelFocus;
            break;
        default:
            return;
    }

    QWidget *focusWidget = widget;
    while (focusWidget) {
        if (focusWidget->isEnabled()
            && focusWidget->rect().contains(localPos)
            && QApplicationPrivate::shouldSetFocus(focusWidget, focusPolicy)) {
            focusWidget->setFocus(Qt::MouseFocusReason);
            break;
        }
        if (focusWidget->isWindow())
            break;

        // find out whether this widget (or its proxy) already has focus
        QWidget *f = focusWidget;
        if (focusWidget->d_func()->extra && focusWidget->d_func()->extra->focus_proxy)
            f = focusWidget->d_func()->extra->focus_proxy;
        // if it has, stop here.
        // otherwise a click on the focused widget would remove its focus if ClickFocus isn't set
        if (f->hasFocus())
            break;

        localPos += focusWidget->pos();
        focusWidget = focusWidget->parentWidget();
    }
}